

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O0

SynModifyAssignType GetModifyAssignType(LexemeType type)

{
  SynModifyAssignType local_c;
  LexemeType type_local;
  
  switch(type) {
  case lex_addset:
    local_c = SYN_MODIFY_ASSIGN_ADD;
    break;
  case lex_subset:
    local_c = SYN_MODIFY_ASSIGN_SUB;
    break;
  case lex_mulset:
    local_c = SYN_MODIFY_ASSIGN_MUL;
    break;
  case lex_divset:
    local_c = SYN_MODIFY_ASSIGN_DIV;
    break;
  case lex_powset:
    local_c = SYN_MODIFY_ASSIGN_POW;
    break;
  case lex_modset:
    local_c = SYN_MODIFY_ASSIGN_MOD;
    break;
  case lex_shlset:
    local_c = SYN_MODIFY_ASSIGN_SHL;
    break;
  case lex_shrset:
    local_c = SYN_MODIFY_ASSIGN_SHR;
    break;
  case lex_andset:
    local_c = SYN_MODIFY_ASSIGN_BIT_AND;
    break;
  case lex_orset:
    local_c = SYN_MODIFY_ASSIGN_BIT_OR;
    break;
  case lex_xorset:
    local_c = SYN_MODIFY_ASSIGN_BIT_XOR;
    break;
  default:
    local_c = SYN_MODIFY_ASSIGN_UNKNOWN;
  }
  return local_c;
}

Assistant:

SynModifyAssignType GetModifyAssignType(LexemeType type)
{
	switch(type)
	{
	case lex_addset:
		return SYN_MODIFY_ASSIGN_ADD;
	case lex_subset:
		return SYN_MODIFY_ASSIGN_SUB;
	case lex_mulset:
		return SYN_MODIFY_ASSIGN_MUL;
	case lex_divset:
		return SYN_MODIFY_ASSIGN_DIV;
	case lex_powset:
		return SYN_MODIFY_ASSIGN_POW;
	case lex_modset:
		return SYN_MODIFY_ASSIGN_MOD;
	case lex_shlset:
		return SYN_MODIFY_ASSIGN_SHL;
	case lex_shrset:
		return SYN_MODIFY_ASSIGN_SHR;
	case lex_andset:
		return SYN_MODIFY_ASSIGN_BIT_AND;
	case lex_orset:
		return SYN_MODIFY_ASSIGN_BIT_OR;
	case lex_xorset:
		return SYN_MODIFY_ASSIGN_BIT_XOR;
	default:
		break;
	}

	return SYN_MODIFY_ASSIGN_UNKNOWN;
}